

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependDouble
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,LPCWSTR clue,double value)

{
  BufferBuilder *value_00;
  ImmutableList<Js::BufferBuilder_*> *pIVar1;
  
  value_00 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x20,this->alloc,0x35916e);
  value_00->clue = clue;
  value_00->offset = 0xffffffff;
  value_00[1]._vptr_BufferBuilder = (_func_int **)value;
  value_00->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_0137a758;
  pIVar1 = regex::ImmutableList<Js::BufferBuilder_*>::Prepend(builder->list,value_00,this->alloc);
  builder->list = pIVar1;
  return 8;
}

Assistant:

uint32 PrependDouble(BufferBuilderList & builder, LPCWSTR clue, double value)
    {
        auto entry = Anew(alloc, BufferBuilderDouble, clue, value);
        builder.list = builder.list->Prepend(entry, alloc);
        return sizeof(double);
    }